

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namespace.cpp
# Opt level: O2

string * __thiscall
LiteScript::_Type_NAMESPACE::ToString_abi_cxx11_
          (string *__return_storage_ptr__,_Type_NAMESPACE *this,Variable *object)

{
  Namespace *this_00;
  uint uVar1;
  Object *pOVar2;
  char *pcVar3;
  ostream *poVar4;
  uint idx;
  stringstream ss;
  undefined1 local_1e8 [48];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::operator<<(local_1a8,"{");
  pOVar2 = Variable::operator->(object);
  this_00 = (Namespace *)pOVar2->data;
  uVar1 = Namespace::Count(this_00);
  for (idx = 0; uVar1 != idx; idx = idx + 1) {
    pcVar3 = Namespace::GetKey(this_00,idx);
    poVar4 = std::operator<<(local_1a8,pcVar3);
    poVar4 = std::operator<<(poVar4,":");
    Namespace::GetVariable((Namespace *)local_1e8,(uint)this_00);
    Variable::operator_cast_to_string((string *)(local_1e8 + 0x10),(Variable *)local_1e8);
    std::operator<<(poVar4,(char *)local_1e8._16_8_);
    std::__cxx11::string::~string((string *)(local_1e8 + 0x10));
    Variable::~Variable((Variable *)local_1e8);
    if (idx < uVar1 - 1) {
      std::operator<<(local_1a8,",");
    }
  }
  std::operator<<(local_1a8,"}");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string LiteScript::_Type_NAMESPACE::ToString(const Variable &object) const {
    std::stringstream ss;
    ss << "{";
    const Namespace& nsp = object->GetData<Namespace>();
    for (unsigned int i = 0, sz = nsp.Count(); i < sz; i++) {
        ss << nsp.GetKey(i) << ":" << ((std::string)(nsp.GetVariable(i))).c_str();
        if (i < sz - 1)
            ss << ",";
    }
    ss << "}";
    return ss.str();
}